

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

bool upb_Message_SetExtensionInt32
               (upb_Message *msg,upb_MiniTableExtension *e,int32_t value,upb_Arena *a)

{
  bool bVar1;
  upb_CType uVar2;
  int32_t local_1c;
  
  local_1c = value;
  uVar2 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only);
  if (uVar2 != kUpb_CType_Int32) {
    uVar2 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only);
    if (uVar2 != kUpb_CType_Enum) {
      __assert_fail("upb_MiniTableExtension_CType(e) == kUpb_CType_Int32 || upb_MiniTableExtension_CType(e) == kUpb_CType_Enum"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x2d2,
                    "bool upb_Message_SetExtensionInt32(struct upb_Message *, const upb_MiniTableExtension *, int32_t, upb_Arena *)"
                   );
    }
  }
  if (((e->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only &
      0xc0) == 0x40) {
    bVar1 = upb_Message_SetExtension(msg,e,&local_1c,a);
    return bVar1;
  }
  __assert_fail("_upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(e) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x2d4,
                "bool upb_Message_SetExtensionInt32(struct upb_Message *, const upb_MiniTableExtension *, int32_t, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE bool upb_Message_SetExtensionInt32(
    struct upb_Message* msg, const upb_MiniTableExtension* e, int32_t value,
    upb_Arena* a) {
  UPB_ASSUME(upb_MiniTableExtension_CType(e) == kUpb_CType_Int32 ||
             upb_MiniTableExtension_CType(e) == kUpb_CType_Enum);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableExtension_GetRep)(e) ==
             kUpb_FieldRep_4Byte);
  return upb_Message_SetExtension(msg, e, &value, a);
}